

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5.cc
# Opt level: O2

int __thiscall MD5::init(MD5 *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  __shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  QPDFCryptoProvider::getImpl();
  std::__shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2> *)this,&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  iVar1 = (*((this->crypto).super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_QPDFCryptoImpl[3])();
  return iVar1;
}

Assistant:

void
MD5::init()
{
    this->crypto = QPDFCryptoProvider::getImpl();
    this->crypto->MD5_init();
}